

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

Token * __thiscall inja::Lexer::scan(Token *__return_storage_ptr__,Lexer *this)

{
  string_view *this_00;
  basic_string_view<char,_std::char_traits<char>_> other;
  basic_string_view<char,_std::char_traits<char>_> other_00;
  basic_string_view<char,_std::char_traits<char>_> other_01;
  int iVar1;
  State SVar2;
  LexerConfig *pLVar3;
  size_type sVar4;
  ulong uVar5;
  size_type sVar6;
  size_t sVar8;
  size_type sVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  ulong pos;
  Kind closeKind;
  size_type sVar13;
  basic_string_view<char,_std::char_traits<char>_> bVar14;
  basic_string_view<char,_std::char_traits<char>_> bVar15;
  string_view sVar16;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  ulong uVar7;
  
  uVar5 = (this->m_in).size_;
  uVar7 = this->m_pos;
  this->m_tok_start = uVar7;
  this_00 = &this->m_in;
  uVar11 = uVar7;
  if (uVar7 < uVar5) {
LAB_001890c5:
    switch(this->m_state) {
    case ExpressionStart:
      this->m_state = ExpressionBody;
      uVar11 = uVar11 + (this->m_config->expression_open)._M_string_length;
      local_40.data_ = (this->m_in).data_;
      this->m_pos = uVar11;
      local_40.size_ = uVar5;
      if (uVar5 < uVar7) {
        uVar7 = uVar5;
      }
      if (uVar11 < uVar7) {
        uVar11 = uVar7;
      }
      if (uVar5 <= uVar11) {
        uVar11 = uVar5;
      }
      sVar16 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_40,uVar7,uVar11 - uVar7);
      __return_storage_ptr__->kind = ExpressionOpen;
      goto LAB_0018935a;
    case ExpressionBody:
      pcVar10 = (this->m_config->expression_close)._M_dataplus._M_p;
      sVar6 = (this->m_config->expression_close)._M_string_length;
      closeKind = ExpressionClose;
      break;
    case LineStart:
      this->m_state = LineBody;
      uVar11 = uVar11 + (this->m_config->line_statement)._M_string_length;
      local_40.data_ = (this->m_in).data_;
      this->m_pos = uVar11;
      local_40.size_ = uVar5;
      if (uVar5 < uVar7) {
        uVar7 = uVar5;
      }
      if (uVar11 < uVar7) {
        uVar11 = uVar7;
      }
      if (uVar5 <= uVar11) {
        uVar11 = uVar5;
      }
      sVar16 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_40,uVar7,uVar11 - uVar7);
      __return_storage_ptr__->kind = LineStatementOpen;
      goto LAB_0018935a;
    case LineBody:
      pcVar10 = "\n";
      sVar6 = 1;
      closeKind = LineStatementClose;
      break;
    case StatementStart:
      this->m_state = StatementBody;
      uVar11 = uVar11 + (this->m_config->statement_open)._M_string_length;
      local_40.data_ = (this->m_in).data_;
      this->m_pos = uVar11;
      local_40.size_ = uVar5;
      if (uVar5 < uVar7) {
        uVar7 = uVar5;
      }
      if (uVar11 < uVar7) {
        uVar11 = uVar7;
      }
      if (uVar5 <= uVar11) {
        uVar11 = uVar5;
      }
      sVar16 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_40,uVar7,uVar11 - uVar7);
      __return_storage_ptr__->kind = StatementOpen;
      goto LAB_0018935a;
    case StatementBody:
      pcVar10 = (this->m_config->statement_close)._M_dataplus._M_p;
      sVar6 = (this->m_config->statement_close)._M_string_length;
      closeKind = StatementClose;
      break;
    case CommentStart:
      this->m_state = CommentBody;
      uVar11 = uVar11 + (this->m_config->comment_open)._M_string_length;
      local_40.data_ = (this->m_in).data_;
      this->m_pos = uVar11;
      local_40.size_ = uVar5;
      if (uVar5 < uVar7) {
        uVar7 = uVar5;
      }
      if (uVar11 < uVar7) {
        uVar11 = uVar7;
      }
      if (uVar5 <= uVar11) {
        uVar11 = uVar5;
      }
      sVar16 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_40,uVar7,uVar11 - uVar7);
      __return_storage_ptr__->kind = CommentOpen;
      goto LAB_0018935a;
    case CommentBody:
      local_40 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                           (this_00,uVar11,0xffffffffffffffff);
      bVar15.data_ = (this->m_config->comment_close)._M_dataplus._M_p;
      bVar15.size_ = (this->m_config->comment_close)._M_string_length;
      sVar4 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find
                        (&local_40,bVar15,0);
      if (sVar4 == 0xffffffffffffffff) {
        uVar5 = (this->m_in).size_;
        local_40 = this->m_in;
        this->m_pos = uVar5;
        uVar7 = this->m_tok_start;
        if (uVar5 < this->m_tok_start) {
          uVar7 = uVar5;
        }
        sVar9 = uVar5 - uVar7;
        goto LAB_001892be;
      }
      this->m_state = Text;
      local_40.data_ = (this->m_in).data_;
      uVar5 = sVar4 + (this->m_config->comment_close)._M_string_length + this->m_pos;
      this->m_pos = uVar5;
      local_40.size_ = (this->m_in).size_;
      uVar7 = this->m_tok_start;
      if (local_40.size_ < this->m_tok_start) {
        uVar7 = local_40.size_;
      }
      if (uVar5 < uVar7) {
        uVar5 = uVar7;
      }
      if (local_40.size_ <= uVar5) {
        uVar5 = local_40.size_;
      }
      sVar16 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_40,uVar7,uVar5 - uVar7);
      __return_storage_ptr__->kind = CommentClose;
      goto LAB_0018935a;
    default:
      goto switchD_001892dc_default;
    }
    sVar16.size_ = sVar6;
    sVar16.data_ = pcVar10;
    scan_body(__return_storage_ptr__,this,sVar16,closeKind);
    return __return_storage_ptr__;
  }
LAB_00189294:
  local_40.size_ = uVar5;
  local_40.data_ = this_00->data_;
  if (uVar5 < uVar7) {
    uVar7 = uVar5;
  }
  if (uVar11 < uVar7) {
    uVar11 = uVar7;
  }
  if (uVar5 <= uVar11) {
    uVar11 = uVar5;
  }
  sVar9 = uVar11 - uVar7;
LAB_001892be:
  sVar16 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                     (&local_40,uVar7,sVar9);
  __return_storage_ptr__->kind = Eof;
LAB_0018935a:
  __return_storage_ptr__->text = sVar16;
  return __return_storage_ptr__;
switchD_001892dc_default:
  bVar14 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                     (this_00,uVar11,0xffffffffffffffff);
  pcVar10 = bVar14.data_;
  if (bVar14.size_ != 0) {
    sVar6 = (this->m_config->open_chars)._M_string_length;
    pcVar12 = pcVar10;
    do {
      if (sVar6 != 0) {
        sVar13 = 0;
        do {
          if (*pcVar12 == (this->m_config->open_chars)._M_dataplus._M_p[sVar13]) {
            if ((pcVar10 + bVar14.size_ == pcVar12) || ((long)pcVar12 - (long)pcVar10 == -1))
            goto LAB_00189329;
            sVar9 = ((long)pcVar12 - (long)pcVar10) + this->m_pos;
            this->m_pos = sVar9;
            bVar15 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                               (this_00,sVar9,0xffffffffffffffff);
            uVar7 = bVar15.size_;
            pLVar3 = this->m_config;
            uVar5 = (pLVar3->expression_open)._M_string_length;
            bVar14.data_ = (pLVar3->expression_open)._M_dataplus._M_p;
            bVar14.size_ = (pLVar3->expression_open)._M_string_length;
            if (uVar7 < uVar5) {
LAB_00189193:
              uVar5 = (pLVar3->statement_open)._M_string_length;
              other.data_ = (pLVar3->statement_open)._M_dataplus._M_p;
              other.size_ = (pLVar3->statement_open)._M_string_length;
              if (uVar5 <= uVar7) {
                local_40 = bVar15;
                iVar1 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
                                  (&local_40,0,uVar5,other);
                if (iVar1 == 0) {
                  SVar2 = StatementStart;
                  goto LAB_0018926b;
                }
                pLVar3 = this->m_config;
              }
              uVar5 = (pLVar3->comment_open)._M_string_length;
              other_00.data_ = (pLVar3->comment_open)._M_dataplus._M_p;
              other_00.size_ = (pLVar3->comment_open)._M_string_length;
              local_40 = bVar15;
              if ((uVar5 <= uVar7) &&
                 (iVar1 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
                                    (&local_40,0,uVar5,other_00), iVar1 == 0)) {
                SVar2 = CommentStart;
                goto LAB_0018926b;
              }
              sVar8 = this->m_pos;
              if (sVar8 == 0) {
LAB_00189210:
                pLVar3 = this->m_config;
                uVar5 = (pLVar3->line_statement)._M_string_length;
                other_01.data_ = (pLVar3->line_statement)._M_dataplus._M_p;
                other_01.size_ = (pLVar3->line_statement)._M_string_length;
                local_40 = bVar15;
                if (uVar5 <= uVar7) {
                  iVar1 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
                                    (&local_40,0,uVar5,other_01);
                  if (iVar1 == 0) {
                    SVar2 = LineStart;
                    goto LAB_0018926b;
                  }
                  sVar8 = this->m_pos;
                }
              }
              else {
                if ((this->m_in).size_ <= sVar8 - 1) {
                  __assert_fail("pos < size()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/inja.hpp"
                                ,0x340,
                                "const_reference nonstd::sv_lite::basic_string_view<char>::data_at(size_type) const [CharT = char, Traits = std::char_traits<char>]"
                               );
                }
                if (this_00->data_[sVar8 - 1] == '\n') goto LAB_00189210;
              }
              this->m_pos = sVar8 + 1;
              uVar5 = (this->m_in).size_;
              uVar7 = this->m_tok_start;
              uVar11 = sVar8 + 1;
            }
            else {
              local_40 = bVar15;
              iVar1 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
                                (&local_40,0,uVar5,bVar14);
              if (iVar1 != 0) {
                pLVar3 = this->m_config;
                goto LAB_00189193;
              }
              SVar2 = ExpressionStart;
LAB_0018926b:
              this->m_state = SVar2;
              uVar7 = this->m_pos;
              uVar5 = (this->m_in).size_;
              pos = this->m_tok_start;
              uVar11 = uVar7;
              if (uVar7 != pos) {
                local_40.size_ = uVar5;
                local_40.data_ = this_00->data_;
                if (uVar5 < pos) {
                  pos = uVar5;
                }
                if (uVar7 < pos) {
                  uVar7 = pos;
                }
                if (uVar5 <= uVar7) {
                  uVar7 = uVar5;
                }
                sVar9 = uVar7 - pos;
                goto LAB_0018934f;
              }
            }
            if (uVar7 < uVar5) goto LAB_001890c5;
            goto LAB_00189294;
          }
          sVar13 = sVar13 + 1;
        } while (sVar6 != sVar13);
      }
      pcVar12 = pcVar12 + 1;
    } while (pcVar12 != pcVar10 + bVar14.size_);
  }
LAB_00189329:
  uVar5 = (this->m_in).size_;
  local_40 = this->m_in;
  this->m_pos = uVar5;
  pos = this->m_tok_start;
  if (uVar5 < this->m_tok_start) {
    pos = uVar5;
  }
  sVar9 = uVar5 - pos;
LAB_0018934f:
  sVar16 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                     (&local_40,pos,sVar9);
  __return_storage_ptr__->kind = Text;
  goto LAB_0018935a;
}

Assistant:

Token scan() {
		m_tok_start = m_pos;

	again:
		if (m_tok_start >= m_in.size()) return make_token(Token::Kind::Eof);

		switch (m_state) {
			default:
			case State::Text: {
				// fast-scan to first open character
				size_t open_start = m_in.substr(m_pos).find_first_of(m_config.open_chars);
				if (open_start == nonstd::string_view::npos) {
					// didn't find open, return remaining text as text token
					m_pos = m_in.size();
					return make_token(Token::Kind::Text);
				}
				m_pos += open_start;

				// try to match one of the opening sequences, and get the close
				nonstd::string_view open_str = m_in.substr(m_pos);
				if (inja::string_view::starts_with(open_str, m_config.expression_open)) {
					m_state = State::ExpressionStart;
				} else if (inja::string_view::starts_with(open_str, m_config.statement_open)) {
					m_state = State::StatementStart;
				} else if (inja::string_view::starts_with(open_str, m_config.comment_open)) {
					m_state = State::CommentStart;
				} else if ((m_pos == 0 || m_in[m_pos - 1] == '\n') &&
						   inja::string_view::starts_with(open_str, m_config.line_statement)) {
					m_state = State::LineStart;
				} else {
					m_pos += 1;  // wasn't actually an opening sequence
					goto again;
				}
				if (m_pos == m_tok_start) goto again;  // don't generate empty token
				return make_token(Token::Kind::Text);
			}
			case State::ExpressionStart: {
				m_state = State::ExpressionBody;
				m_pos += m_config.expression_open.size();
				return make_token(Token::Kind::ExpressionOpen);
			}
			case State::LineStart: {
				m_state = State::LineBody;
				m_pos += m_config.line_statement.size();
				return make_token(Token::Kind::LineStatementOpen);
			}
			case State::StatementStart: {
				m_state = State::StatementBody;
				m_pos += m_config.statement_open.size();
				return make_token(Token::Kind::StatementOpen);
			}
			case State::CommentStart: {
				m_state = State::CommentBody;
				m_pos += m_config.comment_open.size();
				return make_token(Token::Kind::CommentOpen);
			}
			case State::ExpressionBody:
				return scan_body(m_config.expression_close, Token::Kind::ExpressionClose);
			case State::LineBody:
				return scan_body("\n", Token::Kind::LineStatementClose);
			case State::StatementBody:
				return scan_body(m_config.statement_close, Token::Kind::StatementClose);
			case State::CommentBody: {
				// fast-scan to comment close
				size_t end = m_in.substr(m_pos).find(m_config.comment_close);
				if (end == nonstd::string_view::npos) {
					m_pos = m_in.size();
					return make_token(Token::Kind::Eof);
				}
				// return the entire comment in the close token
				m_state = State::Text;
				m_pos += end + m_config.comment_close.size();
				return make_token(Token::Kind::CommentClose);
			}
		}
	}